

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void __thiscall
toml::
result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::cleanup(result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,EVP_PKEY_CTX *ctx)

{
  result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if ((this->is_ok_ & 1U) == 0) {
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure((failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&(this->field_1).succ);
  }
  else {
    success<std::pair<toml::local_date,_toml::detail::region>_>::~success(&(this->field_1).succ);
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
        if(this->is_ok_) {this->succ.~success_type();}
        else             {this->fail.~failure_type();}
        return;
    }